

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file-server.cpp
# Opt level: O2

bool __thiscall GGSock::FileServer::Impl::exists(Impl *this,FileInfo *info)

{
  pointer pFVar1;
  const_reference cVar2;
  __type _Var3;
  long lVar4;
  long lVar5;
  int i;
  size_type __n;
  
  lVar5 = 0x28;
  __n = 0;
  while( true ) {
    lVar4 = (long)(int)(((long)(this->files).
                               super__Vector_base<GGSock::FileServer::FileData,_std::allocator<GGSock::FileServer::FileData>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(this->files).
                              super__Vector_base<GGSock::FileServer::FileData,_std::allocator<GGSock::FileServer::FileData>_>
                              ._M_impl.super__Vector_impl_data._M_start) / 0x68);
    if (lVar4 <= (long)__n) break;
    cVar2 = std::vector<bool,_std::allocator<bool>_>::operator[](&this->fileUsed,__n);
    if (cVar2) {
      pFVar1 = (this->files).
               super__Vector_base<GGSock::FileServer::FileData,_std::allocator<GGSock::FileServer::FileData>_>
               ._M_impl.super__Vector_impl_data._M_start;
      _Var3 = std::operator==(&info->uri,
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              ((long)pFVar1 + lVar5 + -0x28));
      if ((_Var3) && (info->filesize == *(long *)((long)pFVar1 + lVar5 + -8))) {
        _Var3 = std::operator==(&info->filename,
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )((long)&(pFVar1->info).uri._M_dataplus + lVar5));
        if (_Var3) break;
      }
    }
    __n = __n + 1;
    lVar5 = lVar5 + 0x68;
  }
  return (long)__n < lVar4;
}

Assistant:

bool exists(const FileInfo & info) const {
        for (int i = 0; i < (int) files.size(); ++i) {
            if (fileUsed[i] == false) {
                continue;
            }

            const auto & file = files[i];
            if (info.uri == file.info.uri &&
                info.filesize == file.info.filesize &&
                info.filename == file.info.filename) {
                return true;
            }
        }

        return false;
    }